

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixDynamic<> *M)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  ActualDstType actualDst;
  ChMatrixNM<double,_12,_12> Mtmp;
  assign_op<double,_double> local_501;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_500 [2];
  double adStack_4c0 [149];
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)M,0x90,0xc,0xc);
  local_500[0].m_rows.m_value =
       (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  local_500[0].m_cols.m_value =
       (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  local_500[0].m_functor.m_other = 0.0;
  if ((local_500[0].m_cols.m_value | local_500[0].m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (M,local_500,&local_501);
  (*this->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[6])(this);
  (**(code **)((long)this->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric +
              (ulong)((this->use_lumped_mass_matrix ^ 1) << 4) + 0x40))(this,local_500);
  if (((M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows != 0xc
      ) || ((M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
            != 0xc)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)M,0x90,0xc,0xc);
    if (((M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows !=
         0xc) || ((M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                  m_cols != 0xc)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, 12, 12, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data;
  uVar10 = 0xfffffffffffffff8;
  do {
    dVar3 = adStack_4c0[uVar10 + 1];
    dVar4 = adStack_4c0[uVar10 + 2];
    dVar5 = adStack_4c0[uVar10 + 3];
    dVar6 = adStack_4c0[uVar10 + 4];
    dVar7 = adStack_4c0[uVar10 + 5];
    dVar8 = adStack_4c0[uVar10 + 6];
    dVar9 = adStack_4c0[uVar10 + 7];
    pdVar1 = pdVar2 + uVar10 + 8;
    *pdVar1 = adStack_4c0[uVar10];
    pdVar1[1] = dVar3;
    pdVar1[2] = dVar4;
    pdVar1[3] = dVar5;
    pdVar1[4] = dVar6;
    pdVar1[5] = dVar7;
    pdVar1[6] = dVar8;
    pdVar1[7] = dVar9;
    uVar10 = uVar10 + 8;
  } while (uVar10 < 0x88);
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaMatrix(ChMatrixDynamic<>& M) {
    M.setZero(12, 12);

    ComputeAverageSectionParameters();

    ChMatrixNM<double, 12, 12> Mtmp;

    if (use_lumped_mass_matrix) {
        ComputeLumpedInertiaMatrix(Mtmp);
    } else {
        // The most generic function for consistent mass matrix
        ComputeConsistentInertiaMatrix(Mtmp);

        // A simple function for consistent mass matrix, do quick transformation by matrix manipulation
        // Has been validated to be wrong! NEVER use it again
        // ComputeSimpleConsistentInertiaMatrix(Mtmp);
    }
    M = Mtmp;  // transform from ChMatrixNM<double, 12, 12> to ChMatrixDynamic<>
}